

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Statement::visit<hgdb::rtl::Serializer&>(Statement *this,Serializer *visitor)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Serializer *local_18;
  Serializer *visitor_local;
  Statement *this_local;
  
  local_18 = visitor;
  visitor_local = (Serializer *)this;
  switch(this->kind) {
  case Invalid:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visitInvalid
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,this);
    break;
  case Empty:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::EmptyStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(EmptyStatement *)this);
    break;
  case List:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::StatementList>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(StatementList *)this);
    break;
  case Block:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::BlockStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(BlockStatement *)this);
    break;
  case ExpressionStatement:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ExpressionStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(ExpressionStatement *)this
              );
    break;
  case VariableDeclaration:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::VariableDeclStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (VariableDeclStatement *)this);
    break;
  case Return:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ReturnStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(ReturnStatement *)this);
    break;
  case Continue:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ContinueStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(ContinueStatement *)this);
    break;
  case Break:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::BreakStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(BreakStatement *)this);
    break;
  case Disable:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::DisableStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(DisableStatement *)this);
    break;
  case Conditional:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ConditionalStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ConditionalStatement *)this);
    break;
  case Case:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::CaseStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(CaseStatement *)this);
    break;
  case PatternCase:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::PatternCaseStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (PatternCaseStatement *)this);
    break;
  case ForLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ForLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(ForLoopStatement *)this);
    break;
  case RepeatLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::RepeatLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(RepeatLoopStatement *)this
              );
    break;
  case ForeachLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ForeachLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ForeachLoopStatement *)this);
    break;
  case WhileLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::WhileLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(WhileLoopStatement *)this)
    ;
    break;
  case DoWhileLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::DoWhileLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (DoWhileLoopStatement *)this);
    break;
  case ForeverLoop:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ForeverLoopStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ForeverLoopStatement *)this);
    break;
  case Timed:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::TimedStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(TimedStatement *)this);
    break;
  case ImmediateAssertion:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ImmediateAssertionStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ImmediateAssertionStatement *)this);
    break;
  case ConcurrentAssertion:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ConcurrentAssertionStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ConcurrentAssertionStatement *)this);
    break;
  case DisableFork:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::DisableForkStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (DisableForkStatement *)this);
    break;
  case Wait:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::WaitStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(WaitStatement *)this);
    break;
  case WaitFork:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::WaitForkStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(WaitForkStatement *)this);
    break;
  case WaitOrder:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::WaitOrderStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(WaitOrderStatement *)this)
    ;
    break;
  case EventTrigger:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::EventTriggerStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (EventTriggerStatement *)this);
    break;
  case ProceduralAssign:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ProceduralAssignStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ProceduralAssignStatement *)this);
    break;
  case ProceduralDeassign:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::ProceduralDeassignStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (ProceduralDeassignStatement *)this);
    break;
  case RandCase:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::RandCaseStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,(RandCaseStatement *)this);
    break;
  case RandSequence:
    ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::RandSequenceStatement>
              ((ASTVisitor<hgdb::rtl::Serializer,_true,_false> *)visitor,
               (RandSequenceStatement *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x10e);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Statement::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case StatementKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case StatementKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Empty, EmptyStatement);
        CASE(List, StatementList);
        CASE(Block, BlockStatement);
        CASE(ExpressionStatement, ExpressionStatement);
        CASE(VariableDeclaration, VariableDeclStatement);
        CASE(Return, ReturnStatement);
        CASE(Break, BreakStatement);
        CASE(Continue, ContinueStatement);
        CASE(Disable, DisableStatement);
        CASE(Conditional, ConditionalStatement);
        CASE(Case, CaseStatement);
        CASE(PatternCase, PatternCaseStatement);
        CASE(ForLoop, ForLoopStatement);
        CASE(RepeatLoop, RepeatLoopStatement);
        CASE(ForeachLoop, ForeachLoopStatement);
        CASE(WhileLoop, WhileLoopStatement);
        CASE(DoWhileLoop, DoWhileLoopStatement);
        CASE(ForeverLoop, ForeverLoopStatement);
        CASE(Timed, TimedStatement);
        CASE(ImmediateAssertion, ImmediateAssertionStatement);
        CASE(ConcurrentAssertion, ConcurrentAssertionStatement);
        CASE(DisableFork, DisableForkStatement);
        CASE(Wait, WaitStatement);
        CASE(WaitFork, WaitForkStatement);
        CASE(WaitOrder, WaitOrderStatement);
        CASE(EventTrigger, EventTriggerStatement);
        CASE(ProceduralAssign, ProceduralAssignStatement);
        CASE(ProceduralDeassign, ProceduralDeassignStatement);
        CASE(RandCase, RandCaseStatement);
        CASE(RandSequence, RandSequenceStatement);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}